

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  char *pcVar4;
  undefined4 uVar5;
  BBox1f BVar6;
  MemoryMonitorInterface *pMVar7;
  ThreadLocal2 *pTVar8;
  iterator iVar9;
  BBox1f *pBVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  BBox1f BVar27;
  bool bVar28;
  bool bVar29;
  vint *pvVar30;
  BBox1f BVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  char cVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  void *pvVar40;
  ulong uVar41;
  float *pfVar42;
  size_t sVar43;
  undefined8 *puVar44;
  runtime_error *prVar45;
  BBox1f *pBVar46;
  char *pcVar47;
  ulong uVar48;
  BBox1f BVar49;
  ulong uVar50;
  ulong uVar51;
  int iVar52;
  SetMB *this_00;
  mvector<PrimRefMB> *prims;
  BuildRecord *in_00;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  float fVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  task_group_context *in_stack_ffffffffffffe188;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e68 [16];
  undefined1 local_1e48 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e18 [48];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  BBox<embree::Vec3fa> bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1ce8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1cd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cb8;
  BBox1f local_1ca8;
  BBox1f BStack_1ca0;
  float local_1c88;
  float fStack_1c84;
  float fStack_1c80;
  float fStack_1c7c;
  BBox<embree::Vec3fa> blower1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c18;
  BBox1f local_1c08;
  char acStack_1c00 [8];
  BBox1f local_1bf8;
  BBox1f BStack_1bf0;
  BBox1f local_1be8;
  BBox1f BStack_1be0;
  size_t local_1bd8;
  size_t sStack_1bd0;
  BBox1f local_1bc8;
  BBox1f BStack_1bc0;
  BBox1f local_1bb8;
  anon_class_1_0_00000001 reduction;
  BBox<embree::Vec3fa> bupper0;
  undefined8 local_1b28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b10;
  unsigned_long uStack_1b00;
  unsigned_long local_1af8;
  size_t sStack_1af0;
  BBox1f local_1ae8;
  BBox1f BStack_1ae0;
  BBox1f local_1ad8;
  BBox1f BStack_1ad0;
  size_t local_1ac8;
  size_t sStack_1ac0;
  BBox1f local_1ab8;
  float fStack_1ab0;
  float fStack_1aac;
  BBox1f local_1aa8;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19f8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  BBox1f local_1868;
  BBox1f BStack_1860;
  size_t local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  BBox1f BStack_1840;
  BBox1f local_1838;
  undefined8 local_1828;
  undefined8 local_1818;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17e8;
  undefined1 local_17d8 [16];
  BBox<embree::Vec3fa> blower0;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778 [2];
  BBox1f local_1758 [2];
  size_t local_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [32];
  BBox1f local_16f8 [454];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar41 = in->depth;
  if ((this->cfg).maxDepth < uVar41) {
    puVar44 = (undefined8 *)__cxa_allocate_exception(0x30);
    blower0.lower.field_0._0_8_ = &blower0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blower0,"depth limit reached","");
    *puVar44 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar44 + 1) = 1;
    puVar44[2] = puVar44 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar44 + 2),blower0.lower.field_0._0_8_,
               CONCAT44(blower0.lower.field_0.m128[3],blower0.lower.field_0.m128[2]) +
               blower0.lower.field_0._0_8_);
    __cxa_throw(puVar44,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar15 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar16 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar17 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar18 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  uVar19 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.lower.field_0;
  uVar20 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.lower.field_0 + 8);
  uVar21 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar22 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  uVar23 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             lower.field_0;
  uVar24 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.lower.field_0 + 8);
  uVar25 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar26 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar6 = (BBox1f)(in->prims).prims;
  BVar49 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar27 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&blower0,this,&in->prims);
  uVar35 = local_1798._8_8_;
  uVar34 = local_1798._0_8_;
  uVar33 = local_17a8._8_8_;
  uVar32 = local_17a8._0_8_;
  local_1718._16_8_ = blower0.upper.field_0._0_8_;
  local_1718._0_8_ = blower0.lower.field_0._0_8_;
  local_18c8 = uVar15;
  uStack_18c0 = uVar16;
  local_18b8 = uVar17;
  uStack_18b0 = uVar18;
  local_18a8 = uVar19;
  uStack_18a0 = uVar20;
  local_1898 = uVar21;
  uStack_1890 = uVar22;
  local_1888 = uVar23;
  uStack_1880 = uVar24;
  local_1878 = uVar25;
  uStack_1870 = uVar26;
  local_1868 = BVar49;
  BStack_1860 = BVar27;
  local_1858 = values[0].ref.ptr;
  uStack_1850 = values[0]._8_8_;
  local_1848 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1840.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar31 = BStack_1840;
  local_1838 = BVar6;
  local_1828 = blower0.lower.field_0._0_8_;
  local_1818 = blower0.upper.field_0._0_8_;
  local_1808 = local_17a8._0_8_;
  uStack_1800 = local_17a8._8_8_;
  local_17f8 = local_1798._0_8_;
  uStack_17f0 = local_1798._8_8_;
  if ((uVar41 == 1) && (BVar27 != BVar49)) {
    BStack_1840.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1840.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar38 = (long)BVar27 - (long)BVar49;
    if ((ulong)BVar27 < (ulong)BVar49 || lVar38 == 0) {
      auVar57._12_4_ = INFINITY;
      fVar75 = -INFINITY;
    }
    else {
      pfVar42 = &(*(PrimRefMB **)((long)BVar6 + 0x20))[(long)BVar49].time_range.upper;
      fVar75 = -INFINITY;
      auVar57._12_4_ = INFINITY;
      do {
        if (((BBox1f *)(pfVar42 + -1))->lower <= auVar57._12_4_) {
          auVar57._12_4_ = ((BBox1f *)(pfVar42 + -1))->lower;
        }
        fVar74 = *pfVar42;
        if (*pfVar42 <= fVar75) {
          fVar74 = fVar75;
        }
        fVar75 = fVar74;
        pfVar42 = pfVar42 + 0x14;
        lVar38 = lVar38 + -1;
      } while (lVar38 != 0);
    }
    bVar28 = fVar75 < BStack_1840.upper || BStack_1840.lower < auVar57._12_4_;
  }
  else {
    bVar28 = false;
  }
  uVar37 = (long)BVar27 - (long)BVar49;
  BStack_1840 = BVar31;
  if (((uVar37 <= (this->cfg).maxLeafSize) && ((uint)blower0.lower.field_0._12_4_ < 2)) && (!bVar28)
     ) {
    bupper0.lower.field_0._0_8_ = uVar37 * 8;
    pTVar8 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower0.lower.field_0._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&blower1);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)blower1.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (blower0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)blower0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar43 = (alloc.talloc1)->cur;
    uVar41 = (ulong)(-(int)sVar43 & 0xf);
    uVar48 = sVar43 + bupper0.lower.field_0._0_8_ + uVar41;
    (alloc.talloc1)->cur = uVar48;
    if ((alloc.talloc1)->end < uVar48) {
      (alloc.talloc1)->cur = sVar43;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(bupper0.lower.field_0._0_8_ << 2)) {
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
      else {
        blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
        (alloc.talloc1)->ptr = pcVar47;
        sVar43 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar43;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = bupper0.lower.field_0._0_8_;
        if ((ulong)blower0.lower.field_0._0_8_ < (ulong)bupper0.lower.field_0._0_8_) {
          (alloc.talloc1)->cur = 0;
          blower0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower0);
          (alloc.talloc1)->ptr = pcVar47;
          sVar43 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar43;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = blower0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = bupper0.lower.field_0._0_8_;
          if ((ulong)blower0.lower.field_0._0_8_ < (ulong)bupper0.lower.field_0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar47 = (char *)0x0;
            goto LAB_00d4cb18;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar43;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar41;
      pcVar47 = (alloc.talloc1)->ptr + (uVar48 - bupper0.lower.field_0._0_8_);
    }
LAB_00d4cb18:
    uVar41 = 7;
    if (uVar37 < 7) {
      uVar41 = uVar37;
    }
    aVar59 = _DAT_01feb9f0;
    local_17d8 = (undefined1  [16])_DAT_01feba00;
    aVar61 = _DAT_01feba00;
    local_17e8 = _DAT_01feb9f0;
    if (BVar27 != BVar49) {
      uVar48 = 0;
      do {
        pSVar11 = ((this->createLeaf).bvh)->scene;
        fVar75 = (*(PrimRefMB **)((long)local_1838 + 0x20))[(long)BVar49].lbounds.bounds0.lower.
                 field_0.m128[3];
        uVar5 = *(undefined4 *)
                 ((long)&(*(PrimRefMB **)((long)local_1838 + 0x20))[(long)BVar49].lbounds.bounds0.
                         upper.field_0 + 0xc);
        *(float *)(pcVar47 + uVar48 * 8) = fVar75;
        *(undefined4 *)(pcVar47 + uVar48 * 8 + 4) = uVar5;
        pGVar12 = (pSVar11->geometries).items[(uint)fVar75].ptr;
        fVar75 = pGVar12->fnumTimeSegments;
        auVar57._12_4_ = (pGVar12->time_range).lower;
        fVar78 = (pGVar12->time_range).upper - auVar57._12_4_;
        fVar77 = (BStack_1840.lower - auVar57._12_4_) / fVar78;
        fVar78 = (BStack_1840.upper - auVar57._12_4_) / fVar78;
        auVar57._0_4_ = fVar75 * fVar78;
        auVar57._12_4_ = floorf(fVar75 * fVar77);
        fVar74 = ceilf(auVar57._0_4_);
        iVar52 = (int)auVar57._12_4_;
        if (auVar57._12_4_ <= 0.0) {
          auVar57._12_4_ = 0.0;
        }
        auVar57._4_4_ = fVar74;
        if (fVar75 <= fVar74) {
          auVar57._4_4_ = fVar75;
        }
        if (iVar52 < 0) {
          iVar52 = -1;
        }
        iVar14 = (int)fVar75 + 1;
        if ((int)fVar74 < (int)fVar75 + 1) {
          iVar14 = (int)fVar74;
        }
        values[0].ref.ptr = (size_t)pGVar12->userPtr;
        values[0]._12_4_ = (int)auVar57._12_4_;
        values[0]._8_4_ = uVar5;
        values[0].lbounds.bounds0.lower.field_0._0_8_ = &blower0;
        (**(code **)&pGVar12->field_0x58)(values);
        blower1.lower.field_0._0_8_ = pGVar12->userPtr;
        blower1.lower.field_0.m128[3] = (float)(int)auVar57._4_4_;
        blower1.lower.field_0.m128[2] = (float)uVar5;
        blower1.upper.field_0._0_8_ = values;
        (**(code **)&pGVar12->field_0x58)(&blower1);
        fVar74 = fVar75 * fVar77 - auVar57._12_4_;
        if (iVar14 - iVar52 == 1) {
          if (fVar74 <= 0.0) {
            fVar74 = 0.0;
          }
          fVar75 = 1.0 - fVar74;
          auVar67._0_4_ = fVar75 * blower0.lower.field_0.m128[0] + fVar74 * (float)values[0].ref.ptr
          ;
          auVar67._4_4_ = fVar75 * blower0.lower.field_0.m128[1] + fVar74 * values[0].ref.ptr._4_4_;
          auVar67._8_4_ = fVar75 * blower0.lower.field_0.m128[2] + fVar74 * (float)values[0]._8_4_;
          auVar67._12_4_ = fVar75 * blower0.lower.field_0.m128[3] + fVar74 * (float)values[0]._12_4_
          ;
          fVar63 = fVar75 * blower0.upper.field_0.m128[0] +
                   fVar74 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          fVar64 = fVar75 * blower0.upper.field_0.m128[1] +
                   fVar74 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          fVar65 = fVar75 * blower0.upper.field_0.m128[2] +
                   fVar74 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          fVar74 = fVar75 * blower0.upper.field_0.m128[3] +
                   fVar74 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          fVar75 = auVar57._4_4_ - auVar57._0_4_;
          if (auVar57._4_4_ - auVar57._0_4_ <= 0.0) {
            fVar75 = 0.0;
          }
          auVar57._12_4_ = 1.0 - fVar75;
          auVar54._0_4_ =
               (float)values[0].ref.ptr * auVar57._12_4_ + blower0.lower.field_0.m128[0] * fVar75;
          auVar54._4_4_ =
               values[0].ref.ptr._4_4_ * auVar57._12_4_ + blower0.lower.field_0.m128[1] * fVar75;
          auVar54._8_4_ =
               (float)values[0]._8_4_ * auVar57._12_4_ + blower0.lower.field_0.m128[2] * fVar75;
          auVar54._12_4_ =
               (float)values[0]._12_4_ * auVar57._12_4_ + blower0.lower.field_0.m128[3] * fVar75;
          auVar57._0_4_ =
               auVar57._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               fVar75 * blower0.upper.field_0.m128[0];
          auVar57._4_4_ =
               auVar57._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               fVar75 * blower0.upper.field_0.m128[1];
          auVar57._8_4_ =
               auVar57._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               fVar75 * blower0.upper.field_0.m128[2];
          auVar57._12_4_ =
               auVar57._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               fVar75 * blower0.upper.field_0.m128[3];
        }
        else {
          bupper0.lower.field_0._0_8_ = pGVar12->userPtr;
          bupper0.lower.field_0.m128[3] = (float)((int)auVar57._12_4_ + 1);
          bupper0.lower.field_0.m128[2] = (float)uVar5;
          bupper0.upper.field_0._0_8_ = &blower1;
          (**(code **)&pGVar12->field_0x58)(&bupper0);
          bi.lower.field_0._0_8_ = pGVar12->userPtr;
          bi.lower.field_0.m128[3] = (float)((int)auVar57._4_4_ + -1);
          bi.lower.field_0.m128[2] = (float)uVar5;
          bi.upper.field_0._0_8_ = &bupper0;
          (**(code **)&pGVar12->field_0x58)(&bi);
          if (fVar74 <= 0.0) {
            fVar74 = 0.0;
          }
          auVar57._12_4_ = 1.0 - fVar74;
          auVar67._0_4_ =
               blower0.lower.field_0.m128[0] * auVar57._12_4_ +
               blower1.lower.field_0.m128[0] * fVar74;
          auVar67._4_4_ =
               blower0.lower.field_0.m128[1] * auVar57._12_4_ +
               blower1.lower.field_0.m128[1] * fVar74;
          auVar67._8_4_ =
               blower0.lower.field_0.m128[2] * auVar57._12_4_ +
               blower1.lower.field_0.m128[2] * fVar74;
          auVar67._12_4_ =
               blower0.lower.field_0.m128[3] * auVar57._12_4_ +
               blower1.lower.field_0.m128[3] * fVar74;
          fVar63 = auVar57._12_4_ * blower0.upper.field_0.m128[0] +
                   fVar74 * blower1.upper.field_0.m128[0];
          fVar64 = auVar57._12_4_ * blower0.upper.field_0.m128[1] +
                   fVar74 * blower1.upper.field_0.m128[1];
          fVar65 = auVar57._12_4_ * blower0.upper.field_0.m128[2] +
                   fVar74 * blower1.upper.field_0.m128[2];
          fVar74 = auVar57._12_4_ * blower0.upper.field_0.m128[3] +
                   fVar74 * blower1.upper.field_0.m128[3];
          auVar57._12_4_ = auVar57._4_4_ - auVar57._0_4_;
          if (auVar57._4_4_ - auVar57._0_4_ <= 0.0) {
            auVar57._12_4_ = 0.0;
          }
          fVar62 = 1.0 - auVar57._12_4_;
          auVar72._0_8_ =
               CONCAT44(values[0].ref.ptr._4_4_ * fVar62 +
                        bupper0.lower.field_0.m128[1] * auVar57._12_4_,
                        (float)values[0].ref.ptr * fVar62 +
                        bupper0.lower.field_0.m128[0] * auVar57._12_4_);
          auVar72._8_4_ =
               (float)values[0]._8_4_ * fVar62 + bupper0.lower.field_0.m128[2] * auVar57._12_4_;
          auVar72._12_4_ =
               (float)values[0]._12_4_ * fVar62 + bupper0.lower.field_0.m128[3] * auVar57._12_4_;
          auVar57._0_4_ =
               fVar62 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar57._12_4_ * bupper0.upper.field_0.m128[0];
          auVar57._4_4_ =
               fVar62 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar57._12_4_ * bupper0.upper.field_0.m128[1];
          auVar57._8_4_ =
               fVar62 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar57._12_4_ * bupper0.upper.field_0.m128[2];
          auVar57._12_4_ =
               fVar62 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar57._12_4_ * bupper0.upper.field_0.m128[3];
          iVar52 = iVar52 + 1;
          if (iVar52 < iVar14) {
            do {
              fVar62 = ((float)iVar52 / fVar75 - fVar77) / (fVar78 - fVar77);
              fVar60 = 1.0 - fVar62;
              fVar68 = auVar67._4_4_;
              fVar69 = auVar67._8_4_;
              fVar70 = auVar67._12_4_;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_ = pGVar12->userPtr;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[3] = (float)iVar52;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              m128[2] = (float)uVar5;
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
              _0_8_ = &bi;
              (**(code **)&pGVar12->field_0x58)(&right);
              auVar55._0_4_ =
                   bi.lower.field_0.m128[0] - (auVar67._0_4_ * fVar60 + auVar72._0_4_ * fVar62);
              auVar55._4_4_ = bi.lower.field_0.m128[1] - (fVar68 * fVar60 + auVar72._4_4_ * fVar62);
              auVar55._8_4_ = bi.lower.field_0.m128[2] - (fVar69 * fVar60 + auVar72._8_4_ * fVar62);
              auVar55._12_4_ =
                   bi.lower.field_0.m128[3] - (fVar70 * fVar60 + auVar72._12_4_ * fVar62);
              auVar58._0_4_ = bi.upper.field_0.m128[0] - (fVar60 * fVar63 + fVar62 * auVar57._0_4_);
              auVar58._4_4_ = bi.upper.field_0.m128[1] - (fVar60 * fVar64 + fVar62 * auVar57._4_4_);
              auVar58._8_4_ = bi.upper.field_0.m128[2] - (fVar60 * fVar65 + fVar62 * auVar57._8_4_);
              auVar58._12_4_ =
                   bi.upper.field_0.m128[3] - (fVar60 * fVar74 + fVar62 * auVar57._12_4_);
              auVar56 = minps(auVar55,ZEXT816(0));
              auVar66 = maxps(auVar58,ZEXT816(0));
              auVar67._0_4_ = auVar67._0_4_ + auVar56._0_4_;
              auVar67._4_4_ = fVar68 + auVar56._4_4_;
              auVar67._8_4_ = fVar69 + auVar56._8_4_;
              auVar67._12_4_ = fVar70 + auVar56._12_4_;
              auVar54._0_8_ = CONCAT44(auVar56._4_4_ + auVar72._4_4_,auVar56._0_4_ + auVar72._0_4_);
              auVar54._8_4_ = auVar56._8_4_ + auVar72._8_4_;
              auVar54._12_4_ = auVar56._12_4_ + auVar72._12_4_;
              fVar63 = fVar63 + auVar66._0_4_;
              fVar64 = fVar64 + auVar66._4_4_;
              fVar65 = fVar65 + auVar66._8_4_;
              fVar74 = fVar74 + auVar66._12_4_;
              auVar57._0_4_ = auVar66._0_4_ + auVar57._0_4_;
              auVar57._4_4_ = auVar66._4_4_ + auVar57._4_4_;
              auVar57._8_4_ = auVar66._8_4_ + auVar57._8_4_;
              auVar57._12_4_ = auVar66._12_4_ + auVar57._12_4_;
              iVar52 = iVar52 + 1;
              auVar72._8_4_ = auVar54._8_4_;
              auVar72._0_8_ = auVar54._0_8_;
              auVar72._12_4_ = auVar54._12_4_;
            } while (iVar14 != iVar52);
          }
          else {
            auVar54._8_4_ = auVar72._8_4_;
            auVar54._0_8_ = auVar72._0_8_;
            auVar54._12_4_ = auVar72._12_4_;
          }
        }
        aVar61.m128 = (__m128)maxps(aVar61.m128,auVar57);
        aVar59.m128 = (__m128)minps(aVar59.m128,auVar54);
        auVar13._4_4_ = fVar64;
        auVar13._0_4_ = fVar63;
        auVar13._8_4_ = fVar65;
        auVar13._12_4_ = fVar74;
        local_17d8 = maxps(local_17d8,auVar13);
        local_17e8.m128 = (__m128)minps(local_17e8.m128,auVar67);
        BVar49 = (BBox1f)((long)BVar49 + 1);
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar37);
    }
    (__return_storage_ptr__->ref).ptr = uVar41 | (ulong)pcVar47 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_17e8;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)local_17d8;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar59;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar61;
    __return_storage_ptr__->dt = BStack_1840;
    return __return_storage_ptr__;
  }
  lVar38 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar38 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar38 + 0xc) = 0;
    lVar38 = lVar38 + 0xf0;
  } while (lVar38 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  blower0.lower.field_0._0_8_ = uVar41;
  blower0.upper.field_0._0_8_ = uVar15;
  blower0.upper.field_0._8_8_ = uVar16;
  local_17a8._0_8_ = uVar17;
  uVar15 = local_17a8._0_8_;
  local_17a8._8_8_ = uVar18;
  uVar16 = local_17a8._8_8_;
  local_1798._0_8_ = uVar19;
  uVar17 = local_1798._0_8_;
  local_1798._8_8_ = uVar20;
  uVar18 = local_1798._8_8_;
  local_1788._0_8_ = uVar21;
  local_1788._8_8_ = uVar22;
  local_1778[0]._0_8_ = uVar23;
  local_1778[0]._8_8_ = uVar24;
  local_1778[1]._0_8_ = uVar25;
  local_1778[1]._8_8_ = uVar26;
  local_1758[0] = BVar49;
  local_1758[1] = BVar27;
  local_1748[0] = values[0].ref.ptr;
  local_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar6;
  local_17a8._0_4_ = (undefined4)uVar32;
  local_17a8._4_4_ = SUB84(uVar32,4);
  local_16f8[0].lower = (float)local_17a8._0_4_;
  local_16f8[0].upper = (float)local_17a8._4_4_;
  local_17a8._8_4_ = (undefined4)uVar33;
  local_17a8._12_4_ = SUB84(uVar33,4);
  local_16f8[1].lower = (float)local_17a8._8_4_;
  local_16f8[1].upper = (float)local_17a8._12_4_;
  local_1798._0_4_ = (undefined4)uVar34;
  local_1798._4_4_ = SUB84(uVar34,4);
  local_16f8[2].lower = (float)local_1798._0_4_;
  local_16f8[2].upper = (float)local_1798._4_4_;
  local_1798._8_4_ = (undefined4)uVar35;
  local_1798._12_4_ = SUB84(uVar35,4);
  local_16f8[3].lower = (float)local_1798._8_4_;
  local_16f8[3].upper = (float)local_1798._12_4_;
  local_840 = BVar6;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1e38._8_8_ = 0x7f8000007f800000;
  local_1e38._0_8_ = 0x7f8000007f800000;
  local_1e18._8_8_ = 0xff800000ff800000;
  local_1e18._0_8_ = 0xff800000ff800000;
  bVar29 = false;
  local_17a8._0_8_ = uVar15;
  local_17a8._8_8_ = uVar16;
  local_1798._0_8_ = uVar17;
  local_1798._8_8_ = uVar18;
  do {
    if (local_848 == 0) {
      uVar37 = 0xffffffffffffffff;
    }
    else {
      uVar37 = 0xffffffffffffffff;
      pBVar46 = local_1758;
      uVar48 = 0;
      uVar50 = 0;
      do {
        uVar51 = (long)pBVar46[1] - (long)*pBVar46;
        if ((((this->cfg).maxLeafSize < uVar51) || (1 < (uint)pBVar46[9].upper)) || (bVar28)) {
          if (uVar48 < uVar51) {
            uVar37 = uVar50;
            uVar48 = uVar51;
          }
          bVar28 = false;
        }
        uVar50 = uVar50 + 1;
        pBVar46 = pBVar46 + 0x1e;
      } while (local_848 != uVar50);
    }
    if (uVar37 != 0xffffffffffffffff) {
      lVar38 = uVar37 * 0xf0;
      blower1.lower.field_0._0_8_ = uVar41 + 1;
      pSVar3 = (Split *)(local_1718 + lVar38);
      iVar52 = *(int *)(local_1718 + lVar38 + 0xc);
      bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
      if (iVar52 == 0) {
        local_1be8 = local_1758[uVar37 * 0x1e];
        BStack_1ad0 = local_1758[uVar37 * 0x1e + 1];
        bi.lower.field_0._0_8_ = 0x7f8000007f800000;
        bi.lower.field_0._8_8_ = 0x7f8000007f800000;
        bi.upper.field_0._0_8_ = 0xff800000ff800000;
        bi.upper.field_0._8_8_ = 0xff800000ff800000;
        local_1ce8.i[0] = (int)INFINITY;
        local_1ce8.i[1] = (int)INFINITY;
        local_1ce8.i[2] = (int)INFINITY;
        local_1ce8.i[3] = (int)INFINITY;
        local_1cd8.i[0] = (int)-INFINITY;
        local_1cd8.i[1] = (int)-INFINITY;
        local_1cd8.i[2] = (int)-INFINITY;
        local_1cd8.i[3] = (int)-INFINITY;
        local_1cc8.m128[0] = INFINITY;
        local_1cc8.m128[1] = INFINITY;
        local_1cc8._8_8_ = 0x7f8000007f800000;
        local_1cb8.m128[0] = -INFINITY;
        local_1cb8.m128[1] = -INFINITY;
        local_1cb8.m128[2] = -INFINITY;
        local_1cb8.m128[3] = -INFINITY;
        local_1c88 = 0.0;
        local_1ca8.lower = 0.0;
        local_1ca8.upper = 0.0;
        BStack_1ca0.lower = 0.0;
        BStack_1ca0.upper = 0.0;
        fStack_1c84 = 1.0;
        fStack_1c80 = 1.0;
        fStack_1c7c = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + lVar38 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar39 = (long)(1 << (local_1718[lVar38 + 4] & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39 + 8);
        isLeft.split = pSVar3;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        BStack_1be0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar37 * 0x1e] + 0x20),
                                         (size_t)local_1be8,(size_t)BStack_1ad0,
                                         (EmptyTy *)local_19f8,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,
                                         &isLeft,&reduction,&reduction2,0x80,0xc00);
        local_1bb8 = local_1728[uVar37 * 0x1e];
        BVar6 = local_1728[uVar37 * 0x1e + -1];
        blower1.upper.field_0.m128[0] = (float)bi.lower.field_0._0_8_;
        blower1.upper.field_0.m128[1] = (float)((ulong)bi.lower.field_0._0_8_ >> 0x20);
        blower1.upper.field_0.m128[2] = (float)bi.lower.field_0._8_8_;
        blower1.upper.field_0.m128[3] = (float)((ulong)bi.lower.field_0._8_8_ >> 0x20);
        local_1c38._0_8_ = bi.upper.field_0._0_8_;
        local_1c38._8_8_ = bi.upper.field_0._8_8_;
        local_1c28.m128[0] = INFINITY;
        local_1c28.m128[1] = INFINITY;
        local_1c28.m128[2] = INFINITY;
        local_1c28.m128[3] = INFINITY;
        local_1c18.m128[0] = -INFINITY;
        local_1c18.m128[1] = -INFINITY;
        local_1c18.m128[2] = -INFINITY;
        local_1c18.m128[3] = -INFINITY;
        local_1c08.lower = INFINITY;
        local_1c08.upper = INFINITY;
        acStack_1c00[0] = '\0';
        acStack_1c00[1] = '\0';
        acStack_1c00[2] = -0x80;
        acStack_1c00[3] = '\x7f';
        acStack_1c00[4] = '\0';
        acStack_1c00[5] = '\0';
        acStack_1c00[6] = -0x80;
        acStack_1c00[7] = '\x7f';
        local_1bf8.lower = -INFINITY;
        local_1bf8.upper = -INFINITY;
        BStack_1bf0.lower = -INFINITY;
        BStack_1bf0.upper = -INFINITY;
        auVar57._12_4_ = BVar6.lower;
        fVar75 = auVar57._12_4_;
        if (auVar57._12_4_ <= BStack_1bc0.lower) {
          fVar75 = BStack_1bc0.lower;
        }
        fVar74 = BVar6.upper;
        if (fVar74 <= BStack_1bc0.upper) {
          BStack_1bc0.upper = fVar74;
        }
        BStack_1bc0.lower = fVar75;
        bupper0.upper.field_0._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        bupper0.upper.field_0._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        aStack_1b20._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        aStack_1b20._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        aStack_1b10._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1b10._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                     _0_8_;
        sStack_1af0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      _8_8_;
        local_1ae8.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _0_4_;
        local_1ae8.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _4_4_;
        BStack_1ae0.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _8_4_;
        BStack_1ae0.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _12_4_;
        local_1ab8.lower = right.max_time_range.lower;
        local_1ac8 = right.num_time_segments;
        sStack_1ac0 = right.max_num_time_segments;
        if (auVar57._12_4_ <= right.time_range.lower) {
          BVar6.upper = 0.0;
          BVar6.lower = right.time_range.lower;
        }
        fStack_1aac = right.time_range.upper;
        if (fVar74 <= right.time_range.upper) {
          fStack_1aac = fVar74;
        }
        fStack_1ab0 = BVar6.lower;
        local_1ad8 = BStack_1be0;
        local_1aa8 = local_1bb8;
LAB_00d4b361:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = (SetMB *)((long)&blower0 + lVar38 + 0x10);
        if (iVar52 != 2) {
          if (iVar52 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
          }
          else if (iVar52 == 3) {
            SetMB::deterministic_order(this_00);
            splitByGeometry(this,this_00,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
          }
          goto LAB_00d4b361;
        }
        time_range1.lower = *(float *)(local_1718 + lVar38 + 8);
        time_range0.lower = local_1728[uVar37 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar37 * 0x1e + -1].upper;
        local_1aa8 = local_1728[uVar37 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1bb8 = (BBox1f)operator_new(0x28);
        pMVar7 = (this->heuristicTemporalSplit).device;
        BVar6 = local_1758[uVar37 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1bb8 = pMVar7;
        *(undefined1 *)((long)local_1bb8 + 8) = 0;
        *(long *)((long)local_1bb8 + 0x10) = 0;
        *(long *)((long)local_1bb8 + 0x18) = 0;
        *(long *)((long)local_1bb8 + 0x20) = 0;
        lVar39 = (long)BVar6 - (long)local_1758[uVar37 * 0x1e];
        if (lVar39 != 0) {
          uVar48 = lVar39 * 0x50;
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar48,0);
          if (uVar48 < 0x1c00000) {
            pvVar40 = alignedMalloc(uVar48,0x10);
          }
          else {
            pvVar40 = os_malloc(uVar48,(bool *)((long)local_1bb8 + 8));
          }
          *(void **)((long)local_1bb8 + 0x20) = pvVar40;
          *(long *)((long)local_1bb8 + 0x10) = lVar39;
          *(long *)((long)local_1bb8 + 0x18) = lVar39;
        }
        pvVar30 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = local_1aa8.lower;
        vSplitMask.field_0._4_4_ = local_1aa8.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar6 = local_1758[uVar37 * 0x1e];
        BVar49 = local_1758[uVar37 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             0xff800000ff800000;
        right.max_time_range.lower = 0.0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.max_time_range.upper = 1.0;
        right.time_range.lower = 1.0;
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1bb8;
        if ((ulong)((long)BVar49 - (long)BVar6) < 0xc00) {
          isLeft.split = (Split *)BVar6;
          isLeft.vSplitPos = (vint *)BVar49;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&bi,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar30,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)BVar49;
          vSplitPos.field_0.v[1] = (longlong)BVar6;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&bi,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,in_stack_ffffffffffffe188);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar36 != '\0') {
            prVar45 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar45,"task cancelled");
            __cxa_throw(prVar45,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if ((long)BStack_1ca0 - (long)local_1ca8 !=
            (long)local_1758[uVar37 * 0x1e + 1] - (long)local_1758[uVar37 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          BStack_1ca0 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_1bb8 + 0x20),0,
                                           (long)local_1758[uVar37 * 0x1e + 1] -
                                           (long)local_1758[uVar37 * 0x1e],0x400,
                                           (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar15 = vSplitPos.field_0.v[1];
        blower1.upper.field_0.m128[0] = (float)bi.lower.field_0._0_8_;
        blower1.upper.field_0.m128[1] = (float)((ulong)bi.lower.field_0._0_8_ >> 0x20);
        blower1.upper.field_0.m128[2] = (float)bi.lower.field_0._8_8_;
        blower1.upper.field_0.m128[3] = (float)((ulong)bi.lower.field_0._8_8_ >> 0x20);
        local_1c38._0_8_ = bi.upper.field_0._0_8_;
        local_1c38._8_8_ = bi.upper.field_0._8_8_;
        local_1c28._0_8_ = local_1ce8._0_8_;
        local_1c28._8_8_ = local_1ce8._8_8_;
        local_1c18._0_8_ = local_1cd8._0_8_;
        local_1c18._8_8_ = local_1cd8._8_8_;
        local_1c08.lower = local_1cc8.m128[0];
        local_1c08.upper = local_1cc8.m128[1];
        acStack_1c00[0] = local_1cc8._8_1_;
        acStack_1c00[1] = local_1cc8._9_1_;
        acStack_1c00[2] = local_1cc8._10_1_;
        acStack_1c00[3] = local_1cc8._11_1_;
        acStack_1c00[4] = local_1cc8._12_1_;
        acStack_1c00[5] = local_1cc8._13_1_;
        acStack_1c00[6] = local_1cc8._14_1_;
        acStack_1c00[7] = local_1cc8._15_1_;
        local_1bf8.lower = local_1cb8.m128[0];
        local_1bf8.upper = local_1cb8.m128[1];
        BStack_1bf0.lower = local_1cb8.m128[2];
        BStack_1bf0.upper = local_1cb8.m128[3];
        local_1be8 = local_1ca8;
        BStack_1be0 = BStack_1ca0;
        local_1bc8.upper = fStack_1c84;
        local_1bc8.lower = local_1c88;
        BStack_1bc0 = (BBox1f)(CONCAT44(~-(uint)(fStack_1c7c < time_range0.upper) &
                                        (uint)time_range0.upper,
                                        ~-(uint)(fStack_1c80 < time_range0.lower) &
                                        (uint)fStack_1c80) |
                              CONCAT44((uint)fStack_1c7c & -(uint)(fStack_1c7c < time_range0.upper),
                                       (uint)time_range0.lower &
                                       -(uint)(fStack_1c80 < time_range0.lower)));
        BVar6 = local_1758[uVar37 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        _reduction2 = local_1aa8;
        if ((ulong)((long)BVar6 - (long)local_1758[uVar37 * 0x1e]) < 0xc00) {
          vSplitPos.field_0.v[0] = (longlong)local_1758[uVar37 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)BVar6;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar15,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19f8._8_8_ = &reduction2;
          _reduction = (code *)BVar6;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19f8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,in_stack_ffffffffffffe188);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar36 != '\0') {
            prVar45 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar45,"task cancelled");
            __cxa_throw(prVar45,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar39 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1758 + uVar37 * 0x1e);
        right.object_range._end = lVar39 + right.object_range._begin;
        if (lVar39 != (long)local_1758[uVar37 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)local_1aa8 + 0x20),right.object_range._begin,
                          (unsigned_long)local_1758[uVar37 * 0x1e + 1],0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        bupper0.upper.field_0._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        bupper0.upper.field_0._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b28 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
        aStack_1b20._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        aStack_1b20._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        aStack_1b10._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1b10._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        uStack_1b00 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0._8_8_;
        local_1af8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                     _0_8_;
        sStack_1af0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                      _8_8_;
        local_1ae8.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _0_4_;
        local_1ae8.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _4_4_;
        BStack_1ae0.lower =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _8_4_;
        BStack_1ae0.upper =
             (float)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _12_4_;
        local_1ac8 = right.num_time_segments;
        sStack_1ac0 = right.max_num_time_segments;
        local_1ad8.lower = (float)(undefined4)right.object_range._begin;
        local_1ad8.upper = (float)right.object_range._begin._4_4_;
        BStack_1ad0.lower = (float)(undefined4)right.object_range._end;
        BStack_1ad0.upper = (float)right.object_range._end._4_4_;
        local_1ab8.upper = right.max_time_range.upper;
        local_1ab8.lower = right.max_time_range.lower;
        fStack_1ab0 = (float)(~-(uint)(right.time_range.lower < time_range1.lower) &
                              (uint)right.time_range.lower |
                             (uint)time_range1.lower &
                             -(uint)(right.time_range.lower < time_range1.lower));
        fStack_1aac = (float)(~-(uint)(right.time_range.upper < time_range1.upper) &
                              (uint)time_range1.upper |
                             (uint)right.time_range.upper &
                             -(uint)(right.time_range.upper < time_range1.upper));
      }
      bVar53 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&bi,this,(SetMB *)&blower1.upper);
      uVar17 = bi.upper.field_0._0_8_;
      findFallback((Split *)&bi,this,(SetMB *)&bupper0.upper);
      lVar39 = local_640;
      uVar18 = bi.upper.field_0._0_8_;
      uVar16 = bi.lower.field_0._8_8_;
      uVar15 = bi.lower.field_0._0_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar46 = local_8c8[uVar37];
      if (local_1bb8 == *pBVar46) {
        pBVar46[1] = (BBox1f)((long)pBVar46[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar39 * 2 + -1] = local_1bb8;
        local_838[lVar39 * 2].lower = 1.4013e-45;
        local_838[lVar39 * 2].upper = 0.0;
        local_8c8[uVar37] = local_838 + lVar39 * 2 + -1;
      }
      lVar39 = local_640;
      if (local_1aa8 == *pBVar46) {
        local_8c8[local_848] = pBVar46;
        pBVar46[1] = (BBox1f)((long)pBVar46[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar39 * 2 + -1] = local_1aa8;
        local_838[lVar39 * 2].lower = 1.4013e-45;
        local_838[lVar39 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar39 * 2 + -1;
      }
      pBVar10 = pBVar46 + 1;
      *pBVar10 = (BBox1f)((long)*pBVar10 + -1);
      if ((*pBVar10 == (BBox1f)0x0) && (BVar6 = *pBVar46, BVar6 != (BBox1f)0x0)) {
        lVar39 = *(undefined8 *)((long)BVar6 + 0x18);
        pvVar40 = *(void **)((long)BVar6 + 0x20);
        if (pvVar40 != (void *)0x0) {
          if ((ulong)(lVar39 * 0x50) < 0x1c00000) {
            alignedFree(pvVar40);
          }
          else {
            os_free(pvVar40,lVar39 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar39 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar39 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      uVar48 = local_848;
      *(undefined8 *)((long)&blower0 + lVar38) = blower1.lower.field_0._0_8_;
      *(ulong *)((long)&blower0 + lVar38 + 0x10) =
           CONCAT44(blower1.upper.field_0.m128[1],blower1.upper.field_0.m128[0]);
      *(ulong *)((long)&blower0 + lVar38 + 0x18) =
           CONCAT44(blower1.upper.field_0.m128[3],blower1.upper.field_0.m128[2]);
      ((BBox1f *)(local_17a8 + uVar37 * 0xf0))->lower = (float)local_1c38._0_4_;
      ((BBox1f *)(local_17a8 + uVar37 * 0xf0))->upper = local_1c38.m128[1];
      ((BBox1f *)(local_17a8 + uVar37 * 0xf0 + 8))->lower = (float)local_1c38._8_4_;
      ((BBox1f *)(local_17a8 + uVar37 * 0xf0 + 8))->upper = local_1c38.m128[3];
      ((BBox1f *)(local_1798 + uVar37 * 0xf0))->lower = (float)local_1c28._0_4_;
      ((BBox1f *)(local_1798 + uVar37 * 0xf0))->upper = local_1c28.m128[1];
      ((BBox1f *)(local_1798 + uVar37 * 0xf0 + 8))->lower = (float)local_1c28._8_4_;
      ((BBox1f *)(local_1798 + uVar37 * 0xf0 + 8))->upper = local_1c28.m128[3];
      ((BBox1f *)(local_1788 + uVar37 * 0xf0))->lower = (float)local_1c18._0_4_;
      ((BBox1f *)(local_1788 + uVar37 * 0xf0))->upper = local_1c18.m128[1];
      ((BBox1f *)(local_1788 + uVar37 * 0xf0 + 8))->lower = (float)local_1c18._8_4_;
      ((BBox1f *)(local_1788 + uVar37 * 0xf0 + 8))->upper = local_1c18.m128[3];
      *(BBox1f *)(local_1778 + uVar37 * 0xf) = local_1c08;
      *(char (*) [8])((long)local_1778 + uVar37 * 0xf0 + 8) = acStack_1c00;
      local_1758[uVar37 * 0x1e + -2] = local_1bf8;
      local_1758[uVar37 * 0x1e + -1] = BStack_1bf0;
      local_1758[uVar37 * 0x1e] = local_1be8;
      local_1758[uVar37 * 0x1e + 1] = BStack_1be0;
      local_1748[uVar37 * 0x1e] = local_1bd8;
      local_1748[uVar37 * 0x1e + 1] = sStack_1bd0;
      (&local_1738)[uVar37 * 0x1e] = local_1bc8;
      local_1728[uVar37 * 0x1e + -1] = BStack_1bc0;
      *(BBox1f *)&local_1728[uVar37 * 0x1e].lower = local_1bb8;
      pSVar3->sah = INFINITY;
      pSVar3->dim = -1;
      *(undefined8 *)(local_1718 + lVar38 + 8) = 0;
      *(undefined8 *)(local_1718 + lVar38 + 0x10) = uVar17;
      ((BBox1f *)(local_1718 + lVar38 + 0x20))->lower = (float)local_1ce8._0_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x20))->upper = local_1ce8.v[1];
      ((BBox1f *)(local_1718 + lVar38 + 0x28))->lower = (float)local_1ce8._8_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x28))->upper = local_1ce8.v[3];
      ((BBox1f *)(local_1718 + lVar38 + 0x30))->lower = (float)local_1cd8._0_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x30))->upper = local_1cd8.v[1];
      ((BBox1f *)(local_1718 + lVar38 + 0x38))->lower = (float)local_1cd8._8_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x38))->upper = local_1cd8.v[3];
      lVar38 = local_848 * 0xf0;
      *(undefined8 *)((long)&blower0 + lVar38) = bupper0.lower.field_0._0_8_;
      *(undefined8 *)((long)&blower0 + lVar38 + 0x10) = bupper0.upper.field_0._0_8_;
      *(undefined8 *)((long)&blower0 + lVar38 + 0x18) = bupper0.upper.field_0._8_8_;
      *(undefined8 *)(local_17a8 + uVar48 * 0xf0) = local_1b28;
      *(undefined8 *)(local_17a8 + uVar48 * 0xf0 + 8) = aStack_1b20._0_8_;
      *(undefined8 *)(local_1798 + uVar48 * 0xf0) = aStack_1b20._8_8_;
      *(undefined8 *)(local_1798 + uVar48 * 0xf0 + 8) = aStack_1b10._0_8_;
      *(undefined8 *)(local_1788 + uVar48 * 0xf0) = aStack_1b10._8_8_;
      *(unsigned_long *)(local_1788 + uVar48 * 0xf0 + 8) = uStack_1b00;
      *(unsigned_long *)(local_1778 + uVar48 * 0xf) = local_1af8;
      *(size_t *)((long)local_1778 + uVar48 * 0xf0 + 8) = sStack_1af0;
      local_1758[uVar48 * 0x1e + -2] = local_1ae8;
      local_1758[uVar48 * 0x1e + -1] = BStack_1ae0;
      local_1758[uVar48 * 0x1e] = local_1ad8;
      local_1758[uVar48 * 0x1e + 1] = BStack_1ad0;
      local_1748[uVar48 * 0x1e] = local_1ac8;
      local_1748[uVar48 * 0x1e + 1] = sStack_1ac0;
      BVar49.upper = fStack_1aac;
      BVar49.lower = fStack_1ab0;
      (&local_1738)[uVar48 * 0x1e] = local_1ab8;
      local_1728[uVar48 * 0x1e + -1] = BVar49;
      local_1728[uVar48 * 0x1e] = local_1aa8;
      *(undefined8 *)(local_1718 + lVar38) = uVar15;
      *(undefined8 *)(local_1718 + lVar38 + 8) = uVar16;
      *(undefined8 *)(local_1718 + lVar38 + 0x10) = uVar18;
      ((BBox1f *)(local_1718 + lVar38 + 0x20))->lower = (float)local_1ce8._0_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x20))->upper = local_1ce8.v[1];
      ((BBox1f *)(local_1718 + lVar38 + 0x28))->lower = (float)local_1ce8._8_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x28))->upper = local_1ce8.v[3];
      ((BBox1f *)(local_1718 + lVar38 + 0x30))->lower = (float)local_1cd8._0_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x30))->upper = local_1cd8.v[1];
      ((BBox1f *)(local_1718 + lVar38 + 0x38))->lower = (float)local_1cd8._8_4_;
      ((BBox1f *)(local_1718 + lVar38 + 0x38))->upper = local_1cd8.v[3];
      local_848 = local_848 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar29 = (bool)(bVar29 | bVar53);
    }
  } while ((uVar37 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    pfVar42 = &fStack_172c;
    uVar41 = local_848;
    do {
      bVar29 = (bool)(bVar29 | ((in->prims).super_PrimInfoMB.time_range.lower < pfVar42[-1] ||
                               *pfVar42 < (in->prims).super_PrimInfoMB.time_range.upper));
      pfVar42 = pfVar42 + 0x3c;
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  if (!bVar29) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar8 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      bi.lower.field_0._0_8_ = pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&bi);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)bi.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (blower1.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)blower1.lower.field_0._0_8_);
      }
      if (bupper0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar43 = (alloc.talloc0)->cur;
    uVar41 = (ulong)(-(int)sVar43 & 0xf);
    uVar37 = sVar43 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar41;
    (alloc.talloc0)->cur = uVar37;
    if ((alloc.talloc0)->end < uVar37) {
      (alloc.talloc0)->cur = sVar43;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar47;
        sVar43 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar43;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar47;
          sVar43 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar43;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar47 = (char *)0x0;
            goto LAB_00d4c4bc;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar43;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar41;
      pcVar47 = (alloc.talloc0)->ptr +
                (uVar37 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00d4c4bc:
    pcVar47[0x60] = '\0';
    pcVar47[0x61] = '\0';
    pcVar47[0x62] = -0x80;
    pcVar47[99] = '\x7f';
    pcVar47[100] = '\0';
    pcVar47[0x65] = '\0';
    pcVar47[0x66] = -0x80;
    pcVar47[0x67] = '\x7f';
    pcVar47[0x68] = '\0';
    pcVar47[0x69] = '\0';
    pcVar47[0x6a] = -0x80;
    pcVar47[0x6b] = '\x7f';
    pcVar47[0x6c] = '\0';
    pcVar47[0x6d] = '\0';
    pcVar47[0x6e] = -0x80;
    pcVar47[0x6f] = '\x7f';
    pcVar47[0x40] = '\0';
    pcVar47[0x41] = '\0';
    pcVar47[0x42] = -0x80;
    pcVar47[0x43] = '\x7f';
    pcVar47[0x44] = '\0';
    pcVar47[0x45] = '\0';
    pcVar47[0x46] = -0x80;
    pcVar47[0x47] = '\x7f';
    pcVar47[0x48] = '\0';
    pcVar47[0x49] = '\0';
    pcVar47[0x4a] = -0x80;
    pcVar47[0x4b] = '\x7f';
    pcVar47[0x4c] = '\0';
    pcVar47[0x4d] = '\0';
    pcVar47[0x4e] = -0x80;
    pcVar47[0x4f] = '\x7f';
    pcVar47[0x20] = '\0';
    pcVar47[0x21] = '\0';
    pcVar47[0x22] = -0x80;
    pcVar47[0x23] = '\x7f';
    pcVar47[0x24] = '\0';
    pcVar47[0x25] = '\0';
    pcVar47[0x26] = -0x80;
    pcVar47[0x27] = '\x7f';
    pcVar47[0x28] = '\0';
    pcVar47[0x29] = '\0';
    pcVar47[0x2a] = -0x80;
    pcVar47[0x2b] = '\x7f';
    pcVar47[0x2c] = '\0';
    pcVar47[0x2d] = '\0';
    pcVar47[0x2e] = -0x80;
    pcVar47[0x2f] = '\x7f';
    pcVar47[0x70] = '\0';
    pcVar47[0x71] = '\0';
    pcVar47[0x72] = -0x80;
    pcVar47[0x73] = -1;
    pcVar47[0x74] = '\0';
    pcVar47[0x75] = '\0';
    pcVar47[0x76] = -0x80;
    pcVar47[0x77] = -1;
    pcVar47[0x78] = '\0';
    pcVar47[0x79] = '\0';
    pcVar47[0x7a] = -0x80;
    pcVar47[0x7b] = -1;
    pcVar47[0x7c] = '\0';
    pcVar47[0x7d] = '\0';
    pcVar47[0x7e] = -0x80;
    pcVar47[0x7f] = -1;
    pcVar47[0x50] = '\0';
    pcVar47[0x51] = '\0';
    pcVar47[0x52] = -0x80;
    pcVar47[0x53] = -1;
    pcVar47[0x54] = '\0';
    pcVar47[0x55] = '\0';
    pcVar47[0x56] = -0x80;
    pcVar47[0x57] = -1;
    pcVar47[0x58] = '\0';
    pcVar47[0x59] = '\0';
    pcVar47[0x5a] = -0x80;
    pcVar47[0x5b] = -1;
    pcVar47[0x5c] = '\0';
    pcVar47[0x5d] = '\0';
    pcVar47[0x5e] = -0x80;
    pcVar47[0x5f] = -1;
    pcVar47[0x30] = '\0';
    pcVar47[0x31] = '\0';
    pcVar47[0x32] = -0x80;
    pcVar47[0x33] = -1;
    pcVar47[0x34] = '\0';
    pcVar47[0x35] = '\0';
    pcVar47[0x36] = -0x80;
    pcVar47[0x37] = -1;
    pcVar47[0x38] = '\0';
    pcVar47[0x39] = '\0';
    pcVar47[0x3a] = -0x80;
    pcVar47[0x3b] = -1;
    pcVar47[0x3c] = '\0';
    pcVar47[0x3d] = '\0';
    pcVar47[0x3e] = -0x80;
    pcVar47[0x3f] = -1;
    pcVar47[0x80] = '\0';
    pcVar47[0x81] = '\0';
    pcVar47[0x82] = '\0';
    pcVar47[0x83] = '\0';
    pcVar47[0x84] = '\0';
    pcVar47[0x85] = '\0';
    pcVar47[0x86] = '\0';
    pcVar47[0x87] = '\0';
    pcVar47[0x88] = '\0';
    pcVar47[0x89] = '\0';
    pcVar47[0x8a] = '\0';
    pcVar47[0x8b] = '\0';
    pcVar47[0x8c] = '\0';
    pcVar47[0x8d] = '\0';
    pcVar47[0x8e] = '\0';
    pcVar47[0x8f] = '\0';
    pcVar47[0x90] = '\0';
    pcVar47[0x91] = '\0';
    pcVar47[0x92] = '\0';
    pcVar47[0x93] = '\0';
    pcVar47[0x94] = '\0';
    pcVar47[0x95] = '\0';
    pcVar47[0x96] = '\0';
    pcVar47[0x97] = '\0';
    pcVar47[0x98] = '\0';
    pcVar47[0x99] = '\0';
    pcVar47[0x9a] = '\0';
    pcVar47[0x9b] = '\0';
    pcVar47[0x9c] = '\0';
    pcVar47[0x9d] = '\0';
    pcVar47[0x9e] = '\0';
    pcVar47[0x9f] = '\0';
    pcVar47[0xa0] = '\0';
    pcVar47[0xa1] = '\0';
    pcVar47[0xa2] = '\0';
    pcVar47[0xa3] = '\0';
    pcVar47[0xa4] = '\0';
    pcVar47[0xa5] = '\0';
    pcVar47[0xa6] = '\0';
    pcVar47[0xa7] = '\0';
    pcVar47[0xa8] = '\0';
    pcVar47[0xa9] = '\0';
    pcVar47[0xaa] = '\0';
    pcVar47[0xab] = '\0';
    pcVar47[0xac] = '\0';
    pcVar47[0xad] = '\0';
    pcVar47[0xae] = '\0';
    pcVar47[0xaf] = '\0';
    pcVar47[0xb0] = '\0';
    pcVar47[0xb1] = '\0';
    pcVar47[0xb2] = '\0';
    pcVar47[0xb3] = '\0';
    pcVar47[0xb4] = '\0';
    pcVar47[0xb5] = '\0';
    pcVar47[0xb6] = '\0';
    pcVar47[0xb7] = '\0';
    pcVar47[0xb8] = '\0';
    pcVar47[0xb9] = '\0';
    pcVar47[0xba] = '\0';
    pcVar47[0xbb] = '\0';
    pcVar47[0xbc] = '\0';
    pcVar47[0xbd] = '\0';
    pcVar47[0xbe] = '\0';
    pcVar47[0xbf] = '\0';
    pcVar47[0xc0] = '\0';
    pcVar47[0xc1] = '\0';
    pcVar47[0xc2] = '\0';
    pcVar47[0xc3] = '\0';
    pcVar47[0xc4] = '\0';
    pcVar47[0xc5] = '\0';
    pcVar47[0xc6] = '\0';
    pcVar47[199] = '\0';
    pcVar47[200] = '\0';
    pcVar47[0xc9] = '\0';
    pcVar47[0xca] = '\0';
    pcVar47[0xcb] = '\0';
    pcVar47[0xcc] = '\0';
    pcVar47[0xcd] = '\0';
    pcVar47[0xce] = '\0';
    pcVar47[0xcf] = '\0';
    pcVar47[0xd0] = '\0';
    pcVar47[0xd1] = '\0';
    pcVar47[0xd2] = '\0';
    pcVar47[0xd3] = '\0';
    pcVar47[0xd4] = '\0';
    pcVar47[0xd5] = '\0';
    pcVar47[0xd6] = '\0';
    pcVar47[0xd7] = '\0';
    pcVar47[0xd8] = '\0';
    pcVar47[0xd9] = '\0';
    pcVar47[0xda] = '\0';
    pcVar47[0xdb] = '\0';
    pcVar47[0xdc] = '\0';
    pcVar47[0xdd] = '\0';
    pcVar47[0xde] = '\0';
    pcVar47[0xdf] = '\0';
    lVar38 = 0;
    do {
      pcVar4 = pcVar47 + lVar38 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\b';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      lVar38 = lVar38 + 2;
    } while (lVar38 != 4);
    uVar41 = 1;
    goto LAB_00d4c52b;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar8 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar8->alloc0).bytesUsed = 0;
    (pTVar8->alloc0).bytesWasted = 0;
    (pTVar8->alloc0).end = 0;
    (pTVar8->alloc0).allocBlockSize = 0;
    (pTVar8->alloc0).ptr = (char *)0x0;
    (pTVar8->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    bi.lower.field_0._0_8_ = pTVar8;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar9._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&bi);
    }
    else {
      *iVar9._M_current = (ThreadLocal2 *)bi.lower.field_0._0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (blower1.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)blower1.lower.field_0._0_8_);
    }
    if (bupper0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)bupper0.lower.field_0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar43 = (alloc.talloc0)->cur;
  uVar41 = (ulong)(-(int)sVar43 & 0xf);
  uVar37 = sVar43 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar41;
  (alloc.talloc0)->cur = uVar37;
  if ((alloc.talloc0)->end < uVar37) {
    (alloc.talloc0)->cur = sVar43;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar47;
      sVar43 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar43;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar47 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar47;
        sVar43 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar43;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar47 = (char *)0x0;
          goto LAB_00d4c3c1;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar43;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar41;
    pcVar47 = (alloc.talloc0)->ptr +
              (uVar37 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00d4c3c1:
  pcVar47[0xe0] = '\0';
  pcVar47[0xe1] = '\0';
  pcVar47[0xe2] = -0x80;
  pcVar47[0xe3] = '\x7f';
  pcVar47[0xe4] = '\0';
  pcVar47[0xe5] = '\0';
  pcVar47[0xe6] = -0x80;
  pcVar47[0xe7] = '\x7f';
  pcVar47[0xe8] = '\0';
  pcVar47[0xe9] = '\0';
  pcVar47[0xea] = -0x80;
  pcVar47[0xeb] = '\x7f';
  pcVar47[0xec] = '\0';
  pcVar47[0xed] = '\0';
  pcVar47[0xee] = -0x80;
  pcVar47[0xef] = '\x7f';
  pcVar47[0xf0] = '\0';
  pcVar47[0xf1] = '\0';
  pcVar47[0xf2] = -0x80;
  pcVar47[0xf3] = -1;
  pcVar47[0xf4] = '\0';
  pcVar47[0xf5] = '\0';
  pcVar47[0xf6] = -0x80;
  pcVar47[0xf7] = -1;
  pcVar47[0xf8] = '\0';
  pcVar47[0xf9] = '\0';
  pcVar47[0xfa] = -0x80;
  pcVar47[0xfb] = -1;
  pcVar47[0xfc] = '\0';
  pcVar47[0xfd] = '\0';
  pcVar47[0xfe] = -0x80;
  pcVar47[0xff] = -1;
  pcVar47[0x60] = '\0';
  pcVar47[0x61] = '\0';
  pcVar47[0x62] = -0x80;
  pcVar47[99] = '\x7f';
  pcVar47[100] = '\0';
  pcVar47[0x65] = '\0';
  pcVar47[0x66] = -0x80;
  pcVar47[0x67] = '\x7f';
  pcVar47[0x68] = '\0';
  pcVar47[0x69] = '\0';
  pcVar47[0x6a] = -0x80;
  pcVar47[0x6b] = '\x7f';
  pcVar47[0x6c] = '\0';
  pcVar47[0x6d] = '\0';
  pcVar47[0x6e] = -0x80;
  pcVar47[0x6f] = '\x7f';
  pcVar47[0x40] = '\0';
  pcVar47[0x41] = '\0';
  pcVar47[0x42] = -0x80;
  pcVar47[0x43] = '\x7f';
  pcVar47[0x44] = '\0';
  pcVar47[0x45] = '\0';
  pcVar47[0x46] = -0x80;
  pcVar47[0x47] = '\x7f';
  pcVar47[0x48] = '\0';
  pcVar47[0x49] = '\0';
  pcVar47[0x4a] = -0x80;
  pcVar47[0x4b] = '\x7f';
  pcVar47[0x4c] = '\0';
  pcVar47[0x4d] = '\0';
  pcVar47[0x4e] = -0x80;
  pcVar47[0x4f] = '\x7f';
  pcVar47[0x20] = '\0';
  pcVar47[0x21] = '\0';
  pcVar47[0x22] = -0x80;
  pcVar47[0x23] = '\x7f';
  pcVar47[0x24] = '\0';
  pcVar47[0x25] = '\0';
  pcVar47[0x26] = -0x80;
  pcVar47[0x27] = '\x7f';
  pcVar47[0x28] = '\0';
  pcVar47[0x29] = '\0';
  pcVar47[0x2a] = -0x80;
  pcVar47[0x2b] = '\x7f';
  pcVar47[0x2c] = '\0';
  pcVar47[0x2d] = '\0';
  pcVar47[0x2e] = -0x80;
  pcVar47[0x2f] = '\x7f';
  pcVar47[0x70] = '\0';
  pcVar47[0x71] = '\0';
  pcVar47[0x72] = -0x80;
  pcVar47[0x73] = -1;
  pcVar47[0x74] = '\0';
  pcVar47[0x75] = '\0';
  pcVar47[0x76] = -0x80;
  pcVar47[0x77] = -1;
  pcVar47[0x78] = '\0';
  pcVar47[0x79] = '\0';
  pcVar47[0x7a] = -0x80;
  pcVar47[0x7b] = -1;
  pcVar47[0x7c] = '\0';
  pcVar47[0x7d] = '\0';
  pcVar47[0x7e] = -0x80;
  pcVar47[0x7f] = -1;
  pcVar47[0x50] = '\0';
  pcVar47[0x51] = '\0';
  pcVar47[0x52] = -0x80;
  pcVar47[0x53] = -1;
  pcVar47[0x54] = '\0';
  pcVar47[0x55] = '\0';
  pcVar47[0x56] = -0x80;
  pcVar47[0x57] = -1;
  pcVar47[0x58] = '\0';
  pcVar47[0x59] = '\0';
  pcVar47[0x5a] = -0x80;
  pcVar47[0x5b] = -1;
  pcVar47[0x5c] = '\0';
  pcVar47[0x5d] = '\0';
  pcVar47[0x5e] = -0x80;
  pcVar47[0x5f] = -1;
  pcVar47[0x30] = '\0';
  pcVar47[0x31] = '\0';
  pcVar47[0x32] = -0x80;
  pcVar47[0x33] = -1;
  pcVar47[0x34] = '\0';
  pcVar47[0x35] = '\0';
  pcVar47[0x36] = -0x80;
  pcVar47[0x37] = -1;
  pcVar47[0x38] = '\0';
  pcVar47[0x39] = '\0';
  pcVar47[0x3a] = -0x80;
  pcVar47[0x3b] = -1;
  pcVar47[0x3c] = '\0';
  pcVar47[0x3d] = '\0';
  pcVar47[0x3e] = -0x80;
  pcVar47[0x3f] = -1;
  pcVar47[0x80] = '\0';
  pcVar47[0x81] = '\0';
  pcVar47[0x82] = '\0';
  pcVar47[0x83] = '\0';
  pcVar47[0x84] = '\0';
  pcVar47[0x85] = '\0';
  pcVar47[0x86] = '\0';
  pcVar47[0x87] = '\0';
  pcVar47[0x88] = '\0';
  pcVar47[0x89] = '\0';
  pcVar47[0x8a] = '\0';
  pcVar47[0x8b] = '\0';
  pcVar47[0x8c] = '\0';
  pcVar47[0x8d] = '\0';
  pcVar47[0x8e] = '\0';
  pcVar47[0x8f] = '\0';
  pcVar47[0x90] = '\0';
  pcVar47[0x91] = '\0';
  pcVar47[0x92] = '\0';
  pcVar47[0x93] = '\0';
  pcVar47[0x94] = '\0';
  pcVar47[0x95] = '\0';
  pcVar47[0x96] = '\0';
  pcVar47[0x97] = '\0';
  pcVar47[0x98] = '\0';
  pcVar47[0x99] = '\0';
  pcVar47[0x9a] = '\0';
  pcVar47[0x9b] = '\0';
  pcVar47[0x9c] = '\0';
  pcVar47[0x9d] = '\0';
  pcVar47[0x9e] = '\0';
  pcVar47[0x9f] = '\0';
  pcVar47[0xa0] = '\0';
  pcVar47[0xa1] = '\0';
  pcVar47[0xa2] = '\0';
  pcVar47[0xa3] = '\0';
  pcVar47[0xa4] = '\0';
  pcVar47[0xa5] = '\0';
  pcVar47[0xa6] = '\0';
  pcVar47[0xa7] = '\0';
  pcVar47[0xa8] = '\0';
  pcVar47[0xa9] = '\0';
  pcVar47[0xaa] = '\0';
  pcVar47[0xab] = '\0';
  pcVar47[0xac] = '\0';
  pcVar47[0xad] = '\0';
  pcVar47[0xae] = '\0';
  pcVar47[0xaf] = '\0';
  pcVar47[0xb0] = '\0';
  pcVar47[0xb1] = '\0';
  pcVar47[0xb2] = '\0';
  pcVar47[0xb3] = '\0';
  pcVar47[0xb4] = '\0';
  pcVar47[0xb5] = '\0';
  pcVar47[0xb6] = '\0';
  pcVar47[0xb7] = '\0';
  pcVar47[0xb8] = '\0';
  pcVar47[0xb9] = '\0';
  pcVar47[0xba] = '\0';
  pcVar47[0xbb] = '\0';
  pcVar47[0xbc] = '\0';
  pcVar47[0xbd] = '\0';
  pcVar47[0xbe] = '\0';
  pcVar47[0xbf] = '\0';
  pcVar47[0xc0] = '\0';
  pcVar47[0xc1] = '\0';
  pcVar47[0xc2] = '\0';
  pcVar47[0xc3] = '\0';
  pcVar47[0xc4] = '\0';
  pcVar47[0xc5] = '\0';
  pcVar47[0xc6] = '\0';
  pcVar47[199] = '\0';
  pcVar47[200] = '\0';
  pcVar47[0xc9] = '\0';
  pcVar47[0xca] = '\0';
  pcVar47[0xcb] = '\0';
  pcVar47[0xcc] = '\0';
  pcVar47[0xcd] = '\0';
  pcVar47[0xce] = '\0';
  pcVar47[0xcf] = '\0';
  pcVar47[0xd0] = '\0';
  pcVar47[0xd1] = '\0';
  pcVar47[0xd2] = '\0';
  pcVar47[0xd3] = '\0';
  pcVar47[0xd4] = '\0';
  pcVar47[0xd5] = '\0';
  pcVar47[0xd6] = '\0';
  pcVar47[0xd7] = '\0';
  pcVar47[0xd8] = '\0';
  pcVar47[0xd9] = '\0';
  pcVar47[0xda] = '\0';
  pcVar47[0xdb] = '\0';
  pcVar47[0xdc] = '\0';
  pcVar47[0xdd] = '\0';
  pcVar47[0xde] = '\0';
  pcVar47[0xdf] = '\0';
  lVar38 = 0;
  do {
    pcVar4 = pcVar47 + lVar38 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\b';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    lVar38 = lVar38 + 2;
  } while (lVar38 != 4);
  uVar41 = 6;
LAB_00d4c52b:
  local_1e68._8_8_ = 0xff800000ff800000;
  local_1e68._0_8_ = 0xff800000ff800000;
  local_1e48._8_8_ = 0x7f8000007f800000;
  local_1e48._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)&blower0;
  if (local_848 != 0) {
    pBVar46 = &values[0].dt;
    uVar37 = 0;
    local_1e48._8_8_ = 0x7f8000007f800000;
    local_1e48._0_8_ = 0x7f8000007f800000;
    local_1e38._8_8_ = 0x7f8000007f800000;
    local_1e38._0_8_ = 0x7f8000007f800000;
    local_1e68._8_8_ = 0xff800000ff800000;
    local_1e68._0_8_ = 0xff800000ff800000;
    local_1e18._8_8_ = 0xff800000ff800000;
    local_1e18._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&blower1,this,in_00,alloc);
      pBVar46[-10].lower = (float)blower1.lower.field_0._0_4_;
      pBVar46[-10].upper = (float)blower1.lower.field_0._4_4_;
      auVar56._4_4_ = blower1.upper.field_0.m128[1];
      auVar56._0_4_ = blower1.upper.field_0.m128[0];
      auVar56._8_4_ = blower1.upper.field_0.m128[2];
      auVar56._12_4_ = blower1.upper.field_0.m128[3];
      *(undefined1 (*) [16])(pBVar46 + -8) = auVar56;
      pBVar46[-6].lower = (float)local_1c38._0_4_;
      pBVar46[-6].upper = local_1c38.m128[1];
      pBVar46[-5].lower = (float)local_1c38._8_4_;
      pBVar46[-5].upper = local_1c38.m128[3];
      pBVar46[-4].lower = (float)local_1c28._0_4_;
      pBVar46[-4].upper = local_1c28.m128[1];
      pBVar46[-3].lower = (float)local_1c28._8_4_;
      pBVar46[-3].upper = local_1c28.m128[3];
      pBVar46[-2].lower = (float)local_1c18._0_4_;
      pBVar46[-2].upper = local_1c18.m128[1];
      pBVar46[-1].lower = (float)local_1c18._8_4_;
      pBVar46[-1].upper = local_1c18.m128[3];
      *pBVar46 = local_1c08;
      local_1e68 = maxps(local_1e68,*(undefined1 (*) [16])(pBVar46 + -6));
      local_1e38 = minps(local_1e38,*(undefined1 (*) [16])(pBVar46 + -4));
      local_1e48 = minps(local_1e48,auVar56);
      local_1e18._0_16_ = maxps(local_1e18._0_16_,*(undefined1 (*) [16])(pBVar46 + -2));
      uVar37 = uVar37 + 1;
      pBVar46 = pBVar46 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar37 < local_848);
  }
  auVar67 = _DAT_01ff1820;
  auVar56 = _DAT_01ff1810;
  uVar41 = uVar41 | (ulong)pcVar47;
  if (((uint)uVar41 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar48 = (ulong)pcVar47 & 0xfffffffffffffff0;
      pfVar42 = &values[0].dt.upper;
      uVar37 = 0;
      do {
        *(undefined8 *)(uVar48 + uVar37 * 8) = *(undefined8 *)(pfVar42 + -0x15);
        fVar75 = ((BBox1f *)(pfVar42 + -1))->lower;
        fVar74 = 1.0 / (*pfVar42 - fVar75);
        fVar78 = -fVar75 * fVar74;
        auVar57._12_4_ = 1.0 - fVar78;
        auVar71._0_4_ = pfVar42[-0x11] * auVar57._12_4_ + pfVar42[-9] * fVar78;
        auVar71._4_4_ = pfVar42[-0x10] * auVar57._12_4_ + pfVar42[-8] * fVar78;
        auVar71._8_4_ = pfVar42[-0xf] * auVar57._12_4_ + pfVar42[-7] * fVar78;
        auVar71._12_4_ = pfVar42[-0xe] * auVar57._12_4_ + pfVar42[-6] * fVar78;
        auVar73._0_4_ = auVar57._12_4_ * pfVar42[-0xd] + fVar78 * pfVar42[-5];
        auVar73._4_4_ = auVar57._12_4_ * pfVar42[-0xc] + fVar78 * pfVar42[-4];
        auVar73._8_4_ = auVar57._12_4_ * pfVar42[-0xb] + fVar78 * pfVar42[-3];
        auVar73._12_4_ = auVar57._12_4_ * pfVar42[-10] + fVar78 * pfVar42[-2];
        fVar74 = (1.0 - fVar75) * fVar74;
        fVar75 = 1.0 - fVar74;
        auVar66._0_4_ = pfVar42[-0x11] * fVar75 + pfVar42[-9] * fVar74;
        auVar66._4_4_ = pfVar42[-0x10] * fVar75 + pfVar42[-8] * fVar74;
        auVar66._8_4_ = pfVar42[-0xf] * fVar75 + pfVar42[-7] * fVar74;
        auVar66._12_4_ = pfVar42[-0xe] * fVar75 + pfVar42[-6] * fVar74;
        auVar76._0_4_ = fVar75 * pfVar42[-0xd] + fVar74 * pfVar42[-5];
        auVar76._4_4_ = fVar75 * pfVar42[-0xc] + fVar74 * pfVar42[-4];
        auVar76._8_4_ = fVar75 * pfVar42[-0xb] + fVar74 * pfVar42[-3];
        auVar76._12_4_ = fVar75 * pfVar42[-10] + fVar74 * pfVar42[-2];
        auVar71 = minps(auVar71,auVar67);
        auVar73 = maxps(auVar73,auVar56);
        auVar66 = minps(auVar66,auVar67);
        auVar76 = maxps(auVar76,auVar56);
        fVar75 = auVar71._0_4_ - ABS(auVar71._0_4_) * 4.7683716e-07;
        auVar57._12_4_ = auVar71._4_4_ - ABS(auVar71._4_4_) * 4.7683716e-07;
        fVar74 = auVar71._8_4_ - ABS(auVar71._8_4_) * 4.7683716e-07;
        fVar78 = ABS(auVar73._0_4_) * 4.7683716e-07 + auVar73._0_4_;
        fVar77 = ABS(auVar73._4_4_) * 4.7683716e-07 + auVar73._4_4_;
        auVar57._0_4_ = ABS(auVar73._8_4_) * 4.7683716e-07 + auVar73._8_4_;
        *(float *)(uVar48 + 0x20 + uVar37 * 4) = fVar75;
        *(float *)(uVar48 + 0x40 + uVar37 * 4) = auVar57._12_4_;
        *(float *)(uVar48 + 0x60 + uVar37 * 4) = fVar74;
        *(float *)(uVar48 + 0x30 + uVar37 * 4) = fVar78;
        *(float *)(uVar48 + 0x50 + uVar37 * 4) = fVar77;
        *(float *)(uVar48 + 0x70 + uVar37 * 4) = auVar57._0_4_;
        *(float *)(uVar48 + 0x80 + uVar37 * 4) =
             (auVar66._0_4_ - ABS(auVar66._0_4_) * 4.7683716e-07) - fVar75;
        *(float *)(uVar48 + 0xa0 + uVar37 * 4) =
             (auVar66._4_4_ - ABS(auVar66._4_4_) * 4.7683716e-07) - auVar57._12_4_;
        *(float *)(uVar48 + 0xc0 + uVar37 * 4) =
             (auVar66._8_4_ - ABS(auVar66._8_4_) * 4.7683716e-07) - fVar74;
        *(float *)(uVar48 + 0x90 + uVar37 * 4) =
             (ABS(auVar76._0_4_) * 4.7683716e-07 + auVar76._0_4_) - fVar78;
        *(float *)(uVar48 + 0xb0 + uVar37 * 4) =
             (ABS(auVar76._4_4_) * 4.7683716e-07 + auVar76._4_4_) - fVar77;
        *(float *)(uVar48 + 0xd0 + uVar37 * 4) =
             (ABS(auVar76._8_4_) * 4.7683716e-07 + auVar76._8_4_) - auVar57._0_4_;
        uVar37 = uVar37 + 1;
        pfVar42 = pfVar42 + 0x18;
      } while (local_848 != uVar37);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::UserGeometry,embree::Object>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar49 = BStack_1860;
  BVar6 = local_1868;
  if (bVar29) {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&local_18c8;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0._8_8_ = 0x7f8000007f800000;
    bupper0.upper.field_0._0_8_ = 0xff800000ff800000;
    bupper0.upper.field_0._8_8_ = 0xff800000ff800000;
    if ((ulong)((long)BStack_1860 - (long)local_1868) < 0xc00) {
      blower1.lower.field_0._0_4_ = local_1868.lower;
      blower1.lower.field_0._4_4_ = local_1868.upper;
      blower1.lower.field_0._8_4_ = BStack_1860.lower;
      blower1.lower.field_0._12_4_ = BStack_1860.upper;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      blower1.lower.field_0._12_2_ = 0x401;
      tbb::detail::r1::initialize((task_group_context *)&blower1);
      BVar31 = BStack_1860;
      BVar27 = local_1868;
      BStack_1860.lower = BVar49.lower;
      BStack_1860.upper = BVar49.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           BStack_1860.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           BStack_1860.upper;
      local_1868.lower = BVar6.lower;
      local_1868.upper = BVar6.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_ =
           local_1868.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_ =
           local_1868.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      local_1868 = BVar27;
      BStack_1860 = BVar31;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,in_stack_ffffffffffffe188);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar36 != '\0') {
        prVar45 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar45,"task cancelled");
        __cxa_throw(prVar45,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&blower1);
    }
    (__return_storage_ptr__->ref).ptr = uVar41;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = bi.lower.field_0._0_8_
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         bi.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = bi.upper.field_0._0_8_
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         bi.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1ce8._0_8_;
    pBVar46 = (BBox1f *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8);
    pBVar46->lower = (float)local_1ce8._8_4_;
    pBVar46->upper = local_1ce8.v[3];
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar41;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e48._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e68._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e38._8_8_;
    local_1cd8._0_8_ = local_1e18._0_8_;
    local_1cd8._8_8_ = local_1e18._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1cd8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1cd8._8_8_;
  __return_storage_ptr__->dt = BStack_1840;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar41 = 0;
  do {
    pBVar10 = local_8c8[uVar41];
    pBVar46 = pBVar10 + 1;
    *pBVar46 = (BBox1f)((long)*pBVar46 + -1);
    if ((*pBVar46 == (BBox1f)0x0) && (BVar6 = *pBVar10, BVar6 != (BBox1f)0x0)) {
      lVar38 = *(undefined8 *)((long)BVar6 + 0x18);
      pvVar40 = *(void **)((long)BVar6 + 0x20);
      if (pvVar40 != (void *)0x0) {
        if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
          alignedFree(pvVar40);
        }
        else {
          os_free(pvVar40,lVar38 * 0x50,*(bool *)((long)BVar6 + 8));
        }
      }
      if (lVar38 != 0) {
        (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar38 * -0x50,1);
      }
      *(undefined8 *)((long)BVar6 + 0x10) = 0;
      *(undefined8 *)((long)BVar6 + 0x18) = 0;
      *(undefined8 *)((long)BVar6 + 0x20) = 0;
      operator_delete((void *)BVar6);
    }
    uVar41 = uVar41 + 1;
  } while (uVar41 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }